

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

bool __thiscall cvm::BasicValue::operator==(BasicValue *this,BasicValue *RHS)

{
  BasicValue *RHS_local;
  BasicValue *this_local;
  
  if (this->Type == RHS->Type) {
    switch(this->Type) {
    case BoolType:
      this_local._7_1_ = ((this->field_2).BoolVal & 1U) == ((RHS->field_2).BoolVal & 1U);
      break;
    case IntType:
      this_local._7_1_ = (this->field_2).IntVal == (RHS->field_2).IntVal;
      break;
    case DoubleType:
      this_local._7_1_ = (this->field_2).DoubleVal == (RHS->field_2).DoubleVal;
      break;
    case StringType:
      this_local._7_1_ = std::operator==(&this->StrVal,&RHS->StrVal);
      break;
    case VoidType:
      this_local._7_1_ = true;
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BasicValue::operator==(const BasicValue &RHS) const {
  if (Type != RHS.Type)
    return false;
  switch (Type) {
  case BoolType:
    return BoolVal == RHS.BoolVal;
  case IntType:
    return IntVal == RHS.IntVal;
  case DoubleType:
    return DoubleVal == RHS.DoubleVal;
  case StringType:
    return StrVal == RHS.StrVal;
  case VoidType:
    return true;
  default:
    return false;
  }
}